

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O2

mfcc_t *** feat_array_realloc(feat_t *fcb,mfcc_t ***old_feat,int32 ofr,int32 nfr)

{
  mfcc_t ***pppmVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x18a,"mfcc_t ***feat_array_realloc(feat_t *, mfcc_t ***, int32, int32)");
  }
  if (nfr < 1) {
    __assert_fail("nfr > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x18b,"mfcc_t ***feat_array_realloc(feat_t *, mfcc_t ***, int32, int32)");
  }
  if (ofr < 1) {
    __assert_fail("ofr > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x18c,"mfcc_t ***feat_array_realloc(feat_t *, mfcc_t ***, int32, int32)");
  }
  if (fcb->out_dim != 0) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)fcb->n_stream;
    if (fcb->n_stream < 1) {
      uVar2 = uVar3;
    }
    uVar4 = 0;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      uVar4 = uVar4 + fcb->stream_len[uVar3];
    }
    if (fcb->out_dim <= uVar4) {
      if (fcb->sv_dim <= (int)uVar4) {
        pppmVar1 = feat_array_alloc(fcb,nfr);
        if (nfr < ofr) {
          ofr = nfr;
        }
        memcpy(**pppmVar1,**old_feat,(long)(int)(uVar4 * ofr) << 2);
        feat_array_free(old_feat);
        return pppmVar1;
      }
      __assert_fail("k >= fcb->sv_dim",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                    ,0x195,"mfcc_t ***feat_array_realloc(feat_t *, mfcc_t ***, int32, int32)");
    }
    __assert_fail("k >= feat_dimension(fcb)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x194,"mfcc_t ***feat_array_realloc(feat_t *, mfcc_t ***, int32, int32)");
  }
  __assert_fail("feat_dimension(fcb) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                ,0x18d,"mfcc_t ***feat_array_realloc(feat_t *, mfcc_t ***, int32, int32)");
}

Assistant:

mfcc_t ***
feat_array_realloc(feat_t *fcb, mfcc_t ***old_feat, int32 ofr, int32 nfr)
{
    int32 i, k, cf;
    mfcc_t*** new_feat;

    assert(fcb);
    assert(nfr > 0);
    assert(ofr > 0);
    assert(feat_dimension(fcb) > 0);

    /* Make sure to use the dimensionality of the features *before*
       LDA and subvector projection. */
    k = 0;
    for (i = 0; i < fcb->n_stream; ++i)
        k += fcb->stream_len[i];
    assert(k >= feat_dimension(fcb));
    assert(k >= fcb->sv_dim);
    
    new_feat = feat_array_alloc(fcb, nfr);

    cf = (nfr < ofr) ? nfr : ofr;
    memcpy(new_feat[0][0], old_feat[0][0], cf * k * sizeof(mfcc_t));

    feat_array_free(old_feat);
    
    return new_feat;
}